

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hypatia.h
# Opt level: O3

float matrix3_determinant(matrix3 *self)

{
  return ((self->field_0).m[3] * (self->field_0).m[7] - (self->field_0).m[4] * (self->field_0).m[6])
         * (self->field_0).m[2] +
         (((self->field_0).m[4] * (self->field_0).m[8] - (self->field_0).m[5] * (self->field_0).m[7]
          ) * (self->field_0).m[0] -
         ((self->field_0).m[8] * (self->field_0).m[3] - (self->field_0).m[5] * (self->field_0).m[6])
         * (self->field_0).m[1]);
}

Assistant:

HYPAPI HYP_FLOAT matrix3_determinant(const struct matrix3 *self)
{
	HYP_FLOAT determinant;

	determinant =
	  (A(11) * (A2(22, 33) - A2(32, 23)))
	- (A(12) * (A2(21, 33) - A2(31, 23)))
	+ (A(13) * (A2(21, 32) - A2(31, 22)))
	;

	return determinant;
}